

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O2

void __thiscall PA3Application::RenderObject::updateProgram(RenderObject *this)

{
  Program *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (this->m_prog).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"M",&local_39);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(this_00,&local_38,&this->m_mw);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PA3Application::RenderObject::updateProgram() const
{
  m_prog->setUniform("M", m_mw);
}